

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qchar.cpp
# Opt level: O3

QChar * decompositionHelper(char32_t ucs4,qsizetype *length,Decomposition *tag,QChar *buffer)

{
  long lVar1;
  ushort uVar2;
  short sVar3;
  uint uVar4;
  uint uVar5;
  
  uVar4 = ucs4 + L'\xffff5400';
  if (uVar4 < 0x2ba4) {
    uVar5 = (uVar4 & 0xffff) / 0x24c;
    buffer->ucs = (short)uVar5 + L'ᄀ';
    buffer[1].ucs = (short)((uVar4 + uVar5 * -0x24c & 0xffff) * 0x925 >> 0x10) + L'ᅡ';
    sVar3 = (short)((uVar4 & 0xffff) / 0x1c);
    buffer[2].ucs = (short)uVar4 + sVar3 * -0x1c + L'ᆧ';
    *length = 3 - (ulong)((short)uVar4 == (short)(sVar3 * 0x1c));
    *tag = Canonical;
    return buffer;
  }
  if ((uint)ucs4 < 0x3400) {
    uVar5 = (uint)ucs4 >> 4;
    uVar4 = 0xf;
  }
  else {
    if (0x2ffff < (uint)ucs4) goto LAB_0031ffd3;
    uVar5 = ((uint)(ucs4 + L'\xffffcc00') >> 8) + 0x340;
    uVar4 = 0xff;
  }
  if ((ulong)*(ushort *)
              (QUnicodeTables::uc_decomposition_trie +
              (ulong)(uint)((uVar4 & ucs4) +
                           (uint)*(ushort *)
                                  (QUnicodeTables::uc_decomposition_trie + (ulong)uVar5 * 2)) * 2)
      != 0xffff) {
    lVar1 = (ulong)*(ushort *)
                    (QUnicodeTables::uc_decomposition_trie +
                    (ulong)(uint)((uVar4 & ucs4) +
                                 (uint)*(ushort *)
                                        (QUnicodeTables::uc_decomposition_trie + (ulong)uVar5 * 2))
                    * 2) * 2;
    uVar2 = *(ushort *)(QUnicodeTables::uc_decomposition_map + lVar1);
    *tag = (uint)(byte)uVar2;
    *length = (ulong)(uVar2 >> 8);
    return (QChar *)(QUnicodeTables::uc_decomposition_map + lVar1 + 2);
  }
LAB_0031ffd3:
  *length = 0;
  *tag = NoDecomposition;
  return (QChar *)0x0;
}

Assistant:

static const QChar * QT_FASTCALL decompositionHelper(
    char32_t ucs4, qsizetype *length, QChar::Decomposition  *tag, QChar *buffer)
{
    if (ucs4 >= Hangul_SBase && ucs4 < Hangul_SBase + Hangul_SCount) {
        // compute Hangul syllable decomposition as per UAX #15
        const char32_t SIndex = ucs4 - Hangul_SBase;
        buffer[0] = QChar(Hangul_LBase + SIndex / Hangul_NCount); // L
        buffer[1] = QChar(Hangul_VBase + (SIndex % Hangul_NCount) / Hangul_TCount); // V
        buffer[2] = QChar(Hangul_TBase + SIndex % Hangul_TCount); // T
        *length = buffer[2].unicode() == Hangul_TBase ? 2 : 3;
        *tag = QChar::Canonical;
        return buffer;
    }

    const unsigned short index = GET_DECOMPOSITION_INDEX(ucs4);
    if (index == 0xffff) {
        *length = 0;
        *tag = QChar::NoDecomposition;
        return nullptr;
    }

    const unsigned short *decomposition = uc_decomposition_map+index;
    *tag = QChar::Decomposition((*decomposition) & 0xff);
    *length = (*decomposition) >> 8;
    return reinterpret_cast<const QChar *>(decomposition + 1);
}